

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeList.h
# Opt level: O0

CNodeType * __thiscall
Refal2::CNodeList<Refal2::CUnit>::Append(CNodeList<Refal2::CUnit> *this,CUnit *value)

{
  int iVar1;
  undefined4 extraout_var;
  CUnit *value_local;
  CNodeList<Refal2::CUnit> *this_local;
  
  if (this->last == (CNodeType *)0x0) {
    iVar1 = (*this->_vptr_CNodeList[3])(this,value);
    this->first = (CNodeType *)CONCAT44(extraout_var,iVar1);
    this->last = this->first;
  }
  else {
    InsertAfter(this,this->last,value);
  }
  return this->last;
}

Assistant:

typename CNodeList<T>::CNodeType* CNodeList<T>::Append( const T& value )
{
	if( last != nullptr ) {
		InsertAfter( last, value );
	} else {
		first = Alloc( value );
		last = first;
	}
	return last;
}